

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O2

wchar_t file_close(archive_conflict *a,void *client_data)

{
  close(*client_data);
  archive_mstring_clean((archive_mstring *)((long)client_data + 8));
  free(client_data);
  return L'\0';
}

Assistant:

static int
file_close(struct archive *a, void *client_data)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;

	(void)a; /* UNUSED */
	if (mine->buffer != NULL)
		free(mine->buffer);
	free(mine);
	return (ARCHIVE_OK);
}